

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

pool_ptr<soul::AST::Expression> __thiscall
soul::ResolutionPass::FunctionResolver::resolveFunction
          (FunctionResolver *this,PossibleFunction *f,CallOrCast *call,bool ignoreErrorsInGenerics)

{
  Function *function;
  bool bVar1;
  PoolItem *pPVar2;
  undefined7 in_register_00000009;
  long lVar3;
  undefined1 in_R8B;
  Identifier *in_R9;
  string_view other;
  string_view other_00;
  pool_ptr<soul::AST::CommaSeparatedList> local_70;
  CompileMessage local_68;
  
  lVar3 = CONCAT71(in_register_00000009,ignoreErrorsInGenerics);
  other._M_str = "run";
  other._M_len = 3;
  bVar1 = Identifier::operator==
                    ((Identifier *)
                     ((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                      _vptr_ASTObject + 7),other);
  if (!bVar1) {
    other_00._M_str = "init";
    other_00._M_len = 4;
    bVar1 = Identifier::operator==
                      ((Identifier *)
                       ((call->super_CallOrCastBase).super_Expression.super_Statement.
                        super_ASTObject._vptr_ASTObject + 7),other_00);
    if (!bVar1) {
      function = (Function *)
                 (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                 _vptr_ASTObject;
      if ((function->genericWildcards).
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (function->genericWildcards).
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pPVar2 = PoolAllocator::allocateSpaceForObject(*(PoolAllocator **)&f[1].isImpossible,0x48);
        local_70.object = *(CommaSeparatedList **)(lVar3 + 0x30);
        AST::FunctionCall::FunctionCall
                  ((FunctionCall *)&pPVar2->item,(Context *)(lVar3 + 0x10),function,&local_70,false)
        ;
        pPVar2->destructor =
             PoolAllocator::
             allocate<soul::AST::FunctionCall,_soul::AST::Context_&,_soul::AST::Function_&,_soul::pool_ptr<soul::AST::CommaSeparatedList>_&,_bool>
             ::anon_class_1_0_00000001::__invoke;
        (this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.
        _vptr_RewritingASTVisitor = (_func_int **)&pPVar2->item;
      }
      else {
        (**(code **)&f->function[2].super_ASTObject.objectType)(this,f,lVar3,function,in_R8B);
      }
      return (pool_ptr<soul::AST::Expression>)(Expression *)this;
    }
  }
  CompileMessageHelpers::createMessage<soul::Identifier&>
            (&local_68,(CompileMessageHelpers *)0x1,none,0x286741,
             (char *)((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                      _vptr_ASTObject + 7),in_R9);
  AST::Context::throwError((Context *)(lVar3 + 0x10),&local_68,false);
}

Assistant:

pool_ptr<AST::Expression> resolveFunction (const PossibleFunction& f, AST::CallOrCast& call, bool ignoreErrorsInGenerics)
        {
            if (f.function.isRunFunction() || f.function.isUserInitFunction())
                call.context.throwError (Errors::cannotCallFunction (f.function.name));

            if (f.function.isGeneric())
                return createCallToGenericFunction (call, f.function, ignoreErrorsInGenerics);

            return allocator.allocate<AST::FunctionCall> (call.context, f.function, call.arguments, false);
        }